

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_cookie.c
# Opt level: O3

uchar * ares_dns_cookie_fetch(ares_dns_record_t *dnsrec,size_t *len)

{
  ares_bool_t aVar1;
  ares_dns_rr_t *dns_rr;
  uchar *puVar2;
  uchar *val;
  uchar *local_10;
  
  dns_rr = ares_dns_get_opt_rr_const(dnsrec);
  local_10 = (uchar *)0x0;
  *len = 0;
  puVar2 = (uchar *)0x0;
  if ((dns_rr != (ares_dns_rr_t *)0x0) &&
     (aVar1 = ares_dns_rr_get_opt_byid(dns_rr,ARES_RR_OPT_OPTIONS,10,&local_10,len),
     puVar2 = local_10, aVar1 == ARES_FALSE)) {
    puVar2 = (uchar *)0x0;
  }
  return puVar2;
}

Assistant:

static const unsigned char *
  ares_dns_cookie_fetch(const ares_dns_record_t *dnsrec, size_t *len)
{
  const ares_dns_rr_t *rr  = ares_dns_get_opt_rr_const(dnsrec);
  const unsigned char *val = NULL;
  *len                     = 0;

  if (rr == NULL) {
    return NULL;
  }

  if (!ares_dns_rr_get_opt_byid(rr, ARES_RR_OPT_OPTIONS, ARES_OPT_PARAM_COOKIE,
                                &val, len)) {
    return NULL;
  }

  return val;
}